

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NamespaceScope.cpp
# Opt level: O2

void __thiscall xercesc_4_0::NamespaceScope::~NamespaceScope(NamespaceScope *this)

{
  PrefMapElem *p;
  ulong uVar1;
  
  (this->super_XercesNamespaceResolver)._vptr_XercesNamespaceResolver =
       (_func_int **)&PTR_getNamespaceForPrefix_00407dd8;
  for (uVar1 = 0; (uVar1 < this->fStackCapacity && (this->fStack[uVar1] != (StackElem *)0x0));
      uVar1 = uVar1 + 1) {
    p = this->fStack[uVar1]->fMap;
    (*this->fMemoryManager->_vptr_MemoryManager[4])();
    XMemory::operator_delete((XMemory *)this->fStack[uVar1],p);
  }
  (*this->fMemoryManager->_vptr_MemoryManager[4])();
  XMLStringPool::~XMLStringPool(&this->fPrefixPool);
  return;
}

Assistant:

NamespaceScope::~NamespaceScope()
{
    //
    //  Start working from the bottom of the stack and clear it out as we
    //  go up. Once we hit an uninitialized one, we can break out.
    //
    for (unsigned int stackInd = 0; stackInd < fStackCapacity; stackInd++)
    {
        // If this entry has been set, then lets clean it up
        if (!fStack[stackInd])
            break;

        // Delete the row for this entry, then delete the row structure
        fMemoryManager->deallocate(fStack[stackInd]->fMap);//delete [] fStack[stackInd]->fMap;
        delete fStack[stackInd];
    }

    // Delete the stack array itself now
    fMemoryManager->deallocate(fStack);//delete [] fStack;
}